

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O2

bool fileMatch(string *file,Instruction *I)

{
  StringRef RHS;
  bool bVar1;
  DIFile *this;
  StringRef LHS;
  
  llvm::Instruction::getFunction();
  this = (DIFile *)llvm::Function::getSubprogram();
  if (*this != (DIFile)0xf) {
    this = *(DIFile **)(this + (ulong)*(uint *)(this + 8) * -8);
  }
  LHS = llvm::DIFile::getFilename(this);
  RHS.Data = (file->_M_dataplus)._M_p;
  RHS.Length = file->_M_string_length;
  bVar1 = llvm::operator==(LHS,RHS);
  return bVar1;
}

Assistant:

static bool fileMatch(const std::string &file, const llvm::Instruction &I) {
#if LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR <= 7
    const auto *F = I.getParent()->getParent();
    const auto *subprog = llvm::cast<llvm::DISubprogram>(
            F->getMetadata(llvm::LLVMContext::MD_dbg));
#else
    const auto *subprog = I.getFunction()->getSubprogram();
#endif
    return subprog->getFile()->getFilename() == file;
}